

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

sysbvm_tuple_t
sysbvm_function_applyNoCheck3
          (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_tuple_t argument0,
          sysbvm_tuple_t argument1,sysbvm_tuple_t argument2)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t arguments [3];
  
  arguments[0] = argument0;
  arguments[1] = argument1;
  arguments[2] = argument2;
  sVar1 = sysbvm_function_apply(context,function,3,arguments,1);
  return sVar1;
}

Assistant:

SYSBVM_INLINE sysbvm_tuple_t sysbvm_function_applyNoCheck3(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_tuple_t argument0, sysbvm_tuple_t argument1, sysbvm_tuple_t argument2)
{
    sysbvm_tuple_t arguments[] = {
        argument0,
        argument1,
        argument2,
    };
    
    return sysbvm_function_apply(context, function, 3, arguments, SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK);
}